

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O1

void __thiscall smf::MidiEventList::MidiEventList(MidiEventList *this)

{
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)((ulong)(this->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_finish >> 3) < 1000) {
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve(&this->list,1000);
  }
  return;
}

Assistant:

MidiEvent& MidiEventList::back(void) {
	return *list.back();
}